

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void checkAppendMsg(IntegrityCk *pCheck,char *zFormat,...)

{
  long lVar1;
  IntegrityCk *in_RDI;
  long in_FS_OFFSET;
  va_list ap;
  __va_list_tag *in_stack_00000248;
  char *in_stack_00000250;
  sqlite3_str *in_stack_00000258;
  char *in_stack_ffffffffffffff18;
  IntegrityCk *in_stack_ffffffffffffff20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  checkProgress(in_stack_ffffffffffffff20);
  if (in_RDI->mxErr != 0) {
    in_RDI->mxErr = in_RDI->mxErr + -1;
    in_RDI->nErr = in_RDI->nErr + 1;
    if ((in_RDI->errMsg).nChar != 0) {
      sqlite3_str_append((sqlite3_str *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0);
    }
    if (in_RDI->zPfx != (char *)0x0) {
      sqlite3_str_appendf(&in_RDI->errMsg,in_RDI->zPfx,(ulong)in_RDI->v0,(ulong)in_RDI->v1,
                          (ulong)(uint)in_RDI->v2);
    }
    sqlite3_str_vappendf(in_stack_00000258,in_stack_00000250,in_stack_00000248);
    if ((in_RDI->errMsg).accError == '\a') {
      checkOom(in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void checkAppendMsg(
  IntegrityCk *pCheck,
  const char *zFormat,
  ...
){
  va_list ap;
  checkProgress(pCheck);
  if( !pCheck->mxErr ) return;
  pCheck->mxErr--;
  pCheck->nErr++;
  va_start(ap, zFormat);
  if( pCheck->errMsg.nChar ){
    sqlite3_str_append(&pCheck->errMsg, "\n", 1);
  }
  if( pCheck->zPfx ){
    sqlite3_str_appendf(&pCheck->errMsg, pCheck->zPfx,
                        pCheck->v0, pCheck->v1, pCheck->v2);
  }
  sqlite3_str_vappendf(&pCheck->errMsg, zFormat, ap);
  va_end(ap);
  if( pCheck->errMsg.accError==SQLITE_NOMEM ){
    checkOom(pCheck);
  }
}